

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamHeaderValidator_p.cpp
# Opt level: O1

bool __thiscall
BamTools::Internal::SamHeaderValidator::CheckLengthInRange(SamHeaderValidator *this,string *length)

{
  long *plVar1;
  size_type *psVar2;
  bool bVar3;
  uint sequenceLength;
  stringstream lengthStream;
  int local_1e4;
  string local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  string local_1a0 [4];
  ios_base local_120 [264];
  
  if (length->_M_string_length == 0) {
    local_1a0[0]._M_dataplus._M_p = (pointer)&local_1a0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a0,"Sequence entry (@SQ) is missing LN tag","");
    AddError(this,local_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0[0]._M_dataplus._M_p != &local_1a0[0].field_2) {
      operator_delete(local_1a0[0]._M_dataplus._M_p);
    }
    bVar3 = false;
  }
  else {
    std::__cxx11::stringstream::stringstream
              ((stringstream *)local_1a0,(string *)length,_S_out|_S_in);
    std::istream::_M_extract<unsigned_int>((uint *)local_1a0);
    bVar3 = local_1e4 - 1U < 0x1fffffff;
    if (!bVar3) {
      std::operator+(&local_1c0,"Sequence length (LN): ",length);
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_1c0);
      psVar2 = (size_type *)(plVar1 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar1 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar2) {
        local_1e0.field_2._M_allocated_capacity = *psVar2;
        local_1e0.field_2._8_8_ = plVar1[3];
        local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
      }
      else {
        local_1e0.field_2._M_allocated_capacity = *psVar2;
        local_1e0._M_dataplus._M_p = (pointer)*plVar1;
      }
      local_1e0._M_string_length = plVar1[1];
      *plVar1 = (long)psVar2;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      AddError(this,&local_1e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p);
      }
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
    std::ios_base::~ios_base(local_120);
  }
  return bVar3;
}

Assistant:

bool SamHeaderValidator::CheckLengthInRange(const std::string& length)
{

    // invalid if empty
    if (length.empty()) {
        AddError("Sequence entry (@SQ) is missing LN tag");
        return false;
    }

    // convert string length to numeric
    std::stringstream lengthStream(length);
    unsigned int sequenceLength;
    lengthStream >> sequenceLength;

    // invalid if length outside accepted range
    if (sequenceLength < Constants::SAM_SQ_LENGTH_MIN ||
        sequenceLength > Constants::SAM_SQ_LENGTH_MAX) {
        AddError("Sequence length (LN): " + length + " out of range");
        return false;
    }

    // otherwise OK
    return true;
}